

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::scanFlowEntry(Scanner *this)

{
  iterator pcVar1;
  ilist_node_base<false> *piVar2;
  ilist_node_base<false> *piVar3;
  list_type *plVar4;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_30 [16];
  
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = true;
  local_30[0] = 0;
  pcVar1 = this->Current;
  skip(this,1);
  piVar3 = (ilist_node_base<false> *)
           BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->TokenQueue).
                       super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                      (Align)0x4);
  piVar3->Prev = (ilist_node_base<false> *)0x0;
  piVar3->Next = (ilist_node_base<false> *)0x0;
  uStack_50 = SUB84(pcVar1,0);
  uStack_4c = (undefined4)((ulong)pcVar1 >> 0x20);
  *(undefined4 *)&piVar3[1].Prev = 0xb;
  *(undefined4 *)((long)&piVar3[1].Prev + 4) = uStack_54;
  *(undefined4 *)&piVar3[1].Next = uStack_50;
  *(undefined4 *)((long)&piVar3[1].Next + 4) = uStack_4c;
  piVar3[2].Prev = (ilist_node_base<false> *)0x1;
  piVar3[2].Next = (ilist_node_base<false> *)&piVar3[3].Next;
  std::__cxx11::string::_M_construct<char*>((string *)&piVar3[2].Next,local_30,local_30);
  plVar4 = &(this->TokenQueue).List;
  piVar2 = (plVar4->Sentinel).
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  piVar3->Next = (ilist_node_base<false> *)plVar4;
  piVar3->Prev = piVar2;
  piVar2->Next = piVar3;
  (plVar4->Sentinel).
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar3;
  return true;
}

Assistant:

bool Scanner::scanFlowEntry() {
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = true;
  Token T;
  T.Kind = Token::TK_FlowEntry;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}